

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

ScenarioUpperBound * __thiscall
despot::BaseTag::CreateScenarioUpperBound(BaseTag *this,string *name,string *particle_bound_name)

{
  bool bVar1;
  BaseTag *this_00;
  ParticleUpperBound *pPVar2;
  ostream *poVar3;
  string local_78 [48];
  string local_48 [32];
  string *local_28;
  string *particle_bound_name_local;
  string *name_local;
  BaseTag *this_local;
  
  local_28 = particle_bound_name;
  particle_bound_name_local = name;
  name_local = (string *)this;
  bVar1 = std::operator==(name,"TRIVIAL");
  if ((((bVar1) || (bVar1 = std::operator==(name,"DEFAULT"), bVar1)) ||
      (bVar1 = std::operator==(name,"MDP"), bVar1)) ||
     ((bVar1 = std::operator==(name,"SP"), bVar1 ||
      (bVar1 = std::operator==(name,"MANHATTAN"), bVar1)))) {
    std::__cxx11::string::string(local_48,(string *)name);
    this_local = (BaseTag *)(**(code **)(*(long *)this + 0x88))(this,local_48);
    std::__cxx11::string::~string(local_48);
  }
  else {
    bVar1 = std::operator==(name,"LOOKAHEAD");
    if (!bVar1) {
      bVar1 = std::operator!=(name,"print");
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Unsupported upper bound: ");
        poVar3 = std::operator<<(poVar3,(string *)name);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "Supported types: TRIVIAL, MDP, SP, MANHATTAN, LOOKAHEAD (default to SP)"
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cerr,"With base upper bound: LOOKAHEAD");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    this_00 = (BaseTag *)operator_new(0x38);
    std::__cxx11::string::string(local_78,(string *)particle_bound_name);
    pPVar2 = (ParticleUpperBound *)(**(code **)(*(long *)this + 0x88))(this,local_78);
    despot::LookaheadUpperBound::LookaheadUpperBound
              ((LookaheadUpperBound *)this_00,(DSPOMDP *)&this->super_BeliefMDP,
               &this->super_StateIndexer,pPVar2);
    this_local = this_00;
    std::__cxx11::string::~string(local_78);
  }
  return (ScenarioUpperBound *)this_local;
}

Assistant:

ScenarioUpperBound* BaseTag::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (name == "TRIVIAL" || name == "DEFAULT" || name == "MDP" ||
			name == "SP" || name == "MANHATTAN") {
		return CreateParticleUpperBound(name);
	} else if (name == "LOOKAHEAD") {
		return new LookaheadUpperBound(this, *this,
			CreateParticleUpperBound(particle_bound_name));
	} else {
		if (name != "print")
			cerr << "Unsupported upper bound: " << name << endl;
		cerr << "Supported types: TRIVIAL, MDP, SP, MANHATTAN, LOOKAHEAD (default to SP)" << endl;
		cerr << "With base upper bound: LOOKAHEAD" << endl;
		exit(1);
		return NULL;
	}
}